

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * ApprovalTests::TestName::getMisconfiguredBuildHelp
                   (string *__return_storage_ptr__,string *fileName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  HelpMessages::getMisconfiguredBuildHelp(&local_30,fileName);
  ::std::operator+(&local_50,"\n\n",&local_30);
  ::std::operator+(__return_storage_ptr__,&local_50,"\n\n");
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string TestName::getMisconfiguredBuildHelp(const std::string& fileName)
    {
        return "\n\n" + HelpMessages::getMisconfiguredBuildHelp(fileName) + "\n\n";
    }